

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

t_int * over_perf8(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  t_sample g7;
  t_sample g6;
  t_sample g5;
  t_sample g4;
  t_sample g3;
  t_sample g2;
  t_sample g1;
  t_sample g0;
  t_sample f7;
  t_sample f6;
  t_sample f5;
  t_sample f4;
  t_sample f3;
  t_sample f2;
  t_sample f1;
  t_sample f0;
  int n;
  t_sample *out;
  t_sample *in2;
  t_sample *in1;
  t_int *w_local;
  
  in2 = (t_sample *)w[1];
  out = (t_sample *)w[2];
  _f0 = (float *)w[3];
  for (f1 = (t_sample)w[4]; f1 != 0.0; f1 = (t_sample)((int)f1 + -8)) {
    local_74 = in2[1];
    local_78 = in2[2];
    local_7c = in2[3];
    local_80 = in2[4];
    local_84 = in2[5];
    local_88 = in2[6];
    local_8c = in2[7];
    local_70 = *out;
    fVar1 = out[1];
    fVar2 = out[2];
    fVar3 = out[3];
    fVar4 = out[4];
    fVar5 = out[5];
    fVar6 = out[6];
    fVar7 = out[7];
    if ((local_70 != 0.0) || (NAN(local_70))) {
      local_70 = *in2 / local_70;
    }
    else {
      local_70 = 0.0;
    }
    *_f0 = local_70;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_74 = local_74 / fVar1;
    }
    else {
      local_74 = 0.0;
    }
    _f0[1] = local_74;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_78 = local_78 / fVar2;
    }
    else {
      local_78 = 0.0;
    }
    _f0[2] = local_78;
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      local_7c = local_7c / fVar3;
    }
    else {
      local_7c = 0.0;
    }
    _f0[3] = local_7c;
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      local_80 = local_80 / fVar4;
    }
    else {
      local_80 = 0.0;
    }
    _f0[4] = local_80;
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      local_84 = local_84 / fVar5;
    }
    else {
      local_84 = 0.0;
    }
    _f0[5] = local_84;
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      local_88 = local_88 / fVar6;
    }
    else {
      local_88 = 0.0;
    }
    _f0[6] = local_88;
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      local_8c = local_8c / fVar7;
    }
    else {
      local_8c = 0.0;
    }
    _f0[7] = local_8c;
    in2 = in2 + 8;
    out = out + 8;
    _f0 = _f0 + 8;
  }
  return w + 5;
}

Assistant:

t_int *over_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = (g0? f0 / g0 : 0);
        out[1] = (g1? f1 / g1 : 0);
        out[2] = (g2? f2 / g2 : 0);
        out[3] = (g3? f3 / g3 : 0);
        out[4] = (g4? f4 / g4 : 0);
        out[5] = (g5? f5 / g5 : 0);
        out[6] = (g6? f6 / g6 : 0);
        out[7] = (g7? f7 / g7 : 0);
    }
    return (w+5);
}